

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O3

void __thiscall crsGA::ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  pointer pSVar1;
  size_t sVar2;
  thread local_50;
  condition_variable *local_48;
  ThreadSafeQueue<std::function<void_()>_> *local_40;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  
  (this->stop)._M_base._M_i = false;
  local_40 = &this->tasks;
  (this->tasks)._data.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->tasks)._data.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->tasks)._data.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tasks)._data.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tasks)._data.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->tasks)._data.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->tasks)._data.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tasks)._data.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tasks)._data.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->tasks)._data.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )local_40,0);
  (this->tasks)._terminate = false;
  local_48 = &(this->tasks)._data_cond;
  std::condition_variable::condition_variable(local_48);
  *(undefined8 *)((long)&(this->tasks)._mtx.super___mutex_base._M_mutex + 0x10) = 0;
  (this->tasks)._mtx.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tasks)._mtx.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tasks)._mtx.super___mutex_base._M_mutex + 8) = 0;
  (this->tasks)._mtx.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::vector
            (&this->workers,threads,(allocator_type *)&local_50);
  if (threads != 0) {
    sVar2 = 0;
    do {
      local_38.this = this;
      std::thread::thread<crsGA::ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_,,void>
                (&local_50,&local_38);
      pSVar1 = (this->workers).
               super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (pSVar1[sVar2]._t._M_id._M_thread != 0) {
        std::terminate();
      }
      pSVar1[sVar2]._t._M_id._M_thread = (native_handle_type)local_50._M_id._M_thread;
      sVar2 = sVar2 + 1;
    } while (threads != sVar2);
  }
  return;
}

Assistant:

inline ThreadPool::ThreadPool(size_t threads) : stop(false),
                                                tasks(),
                                                workers(threads)
{
    for (size_t i = 0; i < threads; ++i)
        workers[i] = std::thread(
            [this] {
                while (!stop)
                {
                    runPendingTask();
                }
            });
}